

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclCnRunner.cpp
# Opt level: O0

void __thiscall xmrig::OclCnRunner::OclCnRunner(OclCnRunner *this,size_t index,OclLaunchData *data)

{
  initializer_list<_cl_mem_*> __l;
  initializer_list<xmrig::CnBranchKernel_*> __l_00;
  uint32_t uVar1;
  OclVendor OVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  long in_RDX;
  undefined8 *in_RDI;
  uint32_t stridedIndex;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf4;
  allocator_type *__a;
  uint __val;
  vector<_cl_mem_*,_std::allocator<_cl_mem_*>_> *this_00;
  iterator in_stack_fffffffffffffd28;
  size_type in_stack_fffffffffffffd30;
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [8];
  OclLaunchData *in_stack_fffffffffffffd90;
  size_t in_stack_fffffffffffffd98;
  OclBaseRunner *in_stack_fffffffffffffda0;
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  uint32_t local_58;
  undefined *local_50;
  undefined8 local_48;
  undefined1 local_29 [41];
  
  local_29._17_8_ = in_RDX;
  OclBaseRunner::OclBaseRunner
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  *in_RDI = &PTR__OclCnRunner_002b82c0;
  in_RDI[0x15] = 0;
  in_RDI[0x16] = 0;
  in_RDI[0x17] = 0;
  in_RDI[0x18] = 0;
  in_RDI[0x19] = 0;
  in_RDI[0x1a] = 0;
  in_RDI[0x1b] = 0;
  __a = (allocator_type *)(in_RDI + 0x1c);
  local_29._1_8_ = &DAT_0027d5f0;
  local_29._9_8_ = 4;
  this_00 = (vector<_cl_mem_*,_std::allocator<_cl_mem_*>_> *)local_29;
  std::allocator<_cl_mem_*>::allocator((allocator<_cl_mem_*> *)0x216885);
  __l._M_len = in_stack_fffffffffffffd30;
  __l._M_array = in_stack_fffffffffffffd28;
  std::vector<_cl_mem_*,_std::allocator<_cl_mem_*>_>::vector(this_00,__l,__a);
  std::allocator<_cl_mem_*>::~allocator((allocator<_cl_mem_*> *)0x2168b3);
  local_50 = &DAT_0027d610;
  local_48 = 4;
  std::allocator<xmrig::CnBranchKernel_*>::allocator((allocator<xmrig::CnBranchKernel_*> *)0x2168f0)
  ;
  __l_00._M_len = in_stack_fffffffffffffd30;
  __l_00._M_array = (iterator)in_stack_fffffffffffffd28;
  std::vector<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>::vector
            ((vector<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_> *)this_00,
             __l_00,(allocator_type *)__a);
  __val = (uint)((ulong)__a >> 0x20);
  std::allocator<xmrig::CnBranchKernel_*>::~allocator
            ((allocator<xmrig::CnBranchKernel_*> *)0x21691e);
  uVar1 = OclThread::stridedIndex((OclThread *)(local_29._17_8_ + 0x98));
  local_58 = uVar1;
  OVar2 = OclDevice::vendorId((OclDevice *)(local_29._17_8_ + 0x20));
  if (OVar2 == OCL_VENDOR_NVIDIA) {
    local_58 = 0;
  }
  else {
    local_58 = 2;
  }
  std::__cxx11::to_string(__val);
  std::operator+((char *)CONCAT44(uVar1,OVar2),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uVar1,OVar2),
                 (char *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
  std::__cxx11::string::operator+=((string *)(in_RDI + 0x11),local_78);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffd28);
  std::operator+((char *)CONCAT44(uVar1,OVar2),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uVar1,OVar2),
                 (char *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
  std::__cxx11::string::operator+=((string *)(in_RDI + 0x11),local_d8);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_118);
  uVar3 = OclThread::worksize((OclThread *)(local_29._17_8_ + 0x98));
  std::__cxx11::to_string(__val);
  std::operator+((char *)CONCAT44(uVar1,OVar2),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uVar3,in_stack_fffffffffffffcf0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uVar1,OVar2),(char *)CONCAT44(uVar3,in_stack_fffffffffffffcf0));
  std::__cxx11::string::operator+=((string *)(in_RDI + 0x11),local_138);
  std::__cxx11::string::~string(local_138);
  std::__cxx11::string::~string(local_158);
  std::__cxx11::string::~string(local_178);
  std::__cxx11::to_string(__val);
  std::operator+((char *)CONCAT44(uVar1,OVar2),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uVar3,in_stack_fffffffffffffcf0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uVar1,OVar2),(char *)CONCAT44(uVar3,in_stack_fffffffffffffcf0));
  std::__cxx11::string::operator+=((string *)(in_RDI + 0x11),local_198);
  std::__cxx11::string::~string(local_198);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::string::~string(local_1d8);
  uVar4 = OclThread::memChunk((OclThread *)(local_29._17_8_ + 0x98));
  std::__cxx11::to_string(__val);
  std::operator+((char *)CONCAT44(uVar1,OVar2),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uVar3,uVar4));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uVar1,OVar2),(char *)CONCAT44(uVar3,uVar4));
  std::__cxx11::string::operator+=((string *)(in_RDI + 0x11),local_1f8);
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::string::~string(local_218);
  std::__cxx11::string::~string(local_238);
  std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffd28);
  std::operator+((char *)CONCAT44(uVar1,OVar2),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uVar3,uVar4));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uVar1,OVar2),(char *)CONCAT44(uVar3,uVar4));
  std::__cxx11::string::operator+=((string *)(in_RDI + 0x11),local_258);
  std::__cxx11::string::~string(local_258);
  std::__cxx11::string::~string(local_278);
  std::__cxx11::string::~string(local_298);
  OclThread::unrollFactor((OclThread *)(local_29._17_8_ + 0x98));
  std::__cxx11::to_string(__val);
  std::operator+((char *)CONCAT44(uVar1,OVar2),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uVar3,uVar4));
  std::__cxx11::string::operator+=((string *)(in_RDI + 0x11),local_2b8);
  std::__cxx11::string::~string(local_2b8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd28);
  return;
}

Assistant:

xmrig::OclCnRunner::OclCnRunner(size_t index, const OclLaunchData &data) : OclBaseRunner(index, data)
{
    uint32_t stridedIndex = data.thread.stridedIndex();
    if (data.device.vendorId() == OCL_VENDOR_NVIDIA) {
        stridedIndex = 0;
    }
    else {
        stridedIndex = 2;
    }

    m_options += " -DITERATIONS="           + std::to_string(CnAlgo::CN_ITER >> 1) + "U";
    m_options += " -DMASK="                 + std::to_string(CnAlgo::CN_MASK) + "U";
    m_options += " -DWORKSIZE="             + std::to_string(data.thread.worksize()) + "U";
    m_options += " -DSTRIDED_INDEX="        + std::to_string(stridedIndex) + "U";
    m_options += " -DMEM_CHUNK_EXPONENT="   + std::to_string(1u << data.thread.memChunk()) + "U";
    m_options += " -DMEMORY="               + std::to_string(CnAlgo::CN_MEMORY) + "LU";
    m_options += " -DCN_UNROLL="            + std::to_string(data.thread.unrollFactor());
}